

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall deqp::gles31::Functional::anon_unknown_1::ClearCase::deinit(ClearCase *this)

{
  _Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_58;
  vector<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  local_38;
  
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::reset(&(this->m_vbo).
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
         );
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&(this->m_perPrimitiveProgram).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&(this->m_basicProgram).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->m_drawObjects).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->m_drawObjects).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->m_drawObjects).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
             *)&local_58);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ::~vector(&local_38);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::_M_move_assign
            (&this->m_objectVertices,&local_58);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&local_58);
  return;
}

Assistant:

void ClearCase::deinit (void)
{
	m_vbo.clear();
	m_perPrimitiveProgram.clear();
	m_basicProgram.clear();
	m_drawObjects = std::vector<DrawObject>();
	m_objectVertices = std::vector<tcu::Vec4>();
}